

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          ClassNameResolver *name_resolver,bool boxed)

{
  FieldDescriptor *pFVar1;
  JavaType JVar2;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  char *local_60;
  allocator local_22;
  byte local_21;
  FieldDescriptor *pFStack_20;
  bool boxed_local;
  ClassNameResolver *name_resolver_local;
  FieldDescriptor *field_local;
  
  local_21 = (byte)name_resolver & 1;
  pFStack_20 = field;
  name_resolver_local = (ClassNameResolver *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  JVar2 = GetJavaType((FieldDescriptor *)this);
  pFVar1 = pFStack_20;
  if (JVar2 == JAVATYPE_MESSAGE) {
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)name_resolver_local);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (__return_storage_ptr__,(ClassNameResolver *)pFVar1,descriptor);
  }
  else {
    JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
    pFVar1 = pFStack_20;
    if (JVar2 == JAVATYPE_ENUM) {
      descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)name_resolver_local);
      ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
                (__return_storage_ptr__,(ClassNameResolver *)pFVar1,descriptor_00);
    }
    else {
      if ((local_21 & 1) == 0) {
        JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
        local_60 = PrimitiveTypeName(JVar2);
      }
      else {
        JVar2 = GetJavaType((FieldDescriptor *)name_resolver_local);
        local_60 = BoxedPrimitiveTypeName(JVar2);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_60,&local_22);
      std::allocator<char>::~allocator((allocator<char> *)&local_22);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string TypeName(const FieldDescriptor* field,
                ClassNameResolver* name_resolver,
                bool boxed) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return boxed ? BoxedPrimitiveTypeName(GetJavaType(field))
                 : PrimitiveTypeName(GetJavaType(field));
  }
}